

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kernels.cpp
# Opt level: O2

void __thiscall check_PWG::test_method(check_PWG *this)

{
  Persistence_diagram v2;
  Persistence_diagram v1;
  shared_count sStack_1b0;
  function<double_(std::pair<double,_double>,_std::pair<double,_double>)> local_1a8;
  char *local_188;
  char *local_180;
  char *local_178;
  char *local_170;
  undefined1 *local_168;
  undefined1 *local_160;
  char *local_158;
  char *local_150;
  PWG pwg2;
  PWG pwg1;
  
  v1.super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  v2.super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pwg1.number_of_functions_for_vectorization._0_4_ = 0;
  v1.super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  v1.super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  v2.super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  v2.super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pwg2.number_of_functions_for_vectorization =
       CONCAT44(pwg2.number_of_functions_for_vectorization._4_4_,1);
  std::vector<std::pair<double,double>,std::allocator<std::pair<double,double>>>::
  emplace_back<int,int>
            ((vector<std::pair<double,double>,std::allocator<std::pair<double,double>>> *)&v1,
             (int *)&pwg1,(int *)&pwg2);
  pwg1.number_of_functions_for_vectorization._0_4_ = 0;
  pwg2.number_of_functions_for_vectorization =
       CONCAT44(pwg2.number_of_functions_for_vectorization._4_4_,2);
  std::vector<std::pair<double,double>,std::allocator<std::pair<double,double>>>::
  emplace_back<int,int>
            ((vector<std::pair<double,double>,std::allocator<std::pair<double,double>>> *)&v2,
             (int *)&pwg1,(int *)&pwg2);
  pwg2.number_of_functions_for_projections_to_reals = 0;
  pwg2.number_of_functions_for_vectorization = 0x3ff0000000000000;
  pwg2.kernel.super__Function_base._M_functor._M_unused._M_object =
       std::
       _Function_handler<double_(std::pair<double,_double>,_std::pair<double,_double>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_representations/test/kernels.cpp:32:10)>
       ::_M_invoke;
  pwg2._16_8_ = std::
                _Function_handler<double_(std::pair<double,_double>,_std::pair<double,_double>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_representations/test/kernels.cpp:32:10)>
                ::_M_manager;
  Gudhi::Persistence_representations::
  Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>::
  Persistence_heat_maps
            (&pwg1,&v1,
             (function<double_(std::pair<double,_double>,_std::pair<double,_double>)> *)&pwg2);
  std::_Function_base::~_Function_base((_Function_base *)&pwg2);
  local_1a8.super__Function_base._M_functor._8_8_ = 0;
  local_1a8.super__Function_base._M_functor._M_unused._M_member_pointer = 0x3ff0000000000000;
  local_1a8._M_invoker =
       std::
       _Function_handler<double_(std::pair<double,_double>,_std::pair<double,_double>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_representations/test/kernels.cpp:32:10)>
       ::_M_invoke;
  local_1a8.super__Function_base._M_manager =
       std::
       _Function_handler<double_(std::pair<double,_double>,_std::pair<double,_double>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_representations/test/kernels.cpp:32:10)>
       ::_M_manager;
  Gudhi::Persistence_representations::
  Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>::
  Persistence_heat_maps(&pwg2,&v2,&local_1a8);
  std::_Function_base::~_Function_base(&local_1a8.super__Function_base);
  local_158 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_representations/test/kernels.cpp"
  ;
  local_150 = "";
  local_168 = &boost::unit_test::basic_cstring<char_const>::null;
  local_160 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_158,0x29);
  Gudhi::Persistence_representations::
  Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>::
  compute_scalar_product(&pwg1,&pwg2);
  sStack_1b0.pi_ = (sp_counted_base *)0x0;
  local_1a8._M_invoker = (_Invoker_type)&local_178;
  local_178 = 
  "std::abs(pwg1.compute_scalar_product(pwg2) - std::exp(-0.5)/(std::sqrt(2*Gudhi::Persistence_representations::pi))) <= 1e-3"
  ;
  local_170 = "";
  local_1a8.super__Function_base._M_functor._8_8_ =
       local_1a8.super__Function_base._M_functor._8_8_ & 0xffffffffffffff00;
  local_1a8.super__Function_base._M_functor._M_unused._M_object = &PTR__lazy_ostream_0010fd48;
  local_1a8.super__Function_base._M_manager = (_Manager_type)&boost::unit_test::lazy_ostream::inst;
  local_188 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_representations/test/kernels.cpp"
  ;
  local_180 = "";
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_1b0);
  Gudhi::Persistence_representations::
  Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>::
  ~Persistence_heat_maps(&pwg2);
  Gudhi::Persistence_representations::
  Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>::
  ~Persistence_heat_maps(&pwg1);
  std::_Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
  ~_Vector_base(&v2.
                 super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
               );
  std::_Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
  ~_Vector_base(&v1.
                 super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
               );
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(check_PWG) {
  Persistence_diagram v1, v2; v1.emplace_back(0,1); v2.emplace_back(0,2);
  PWG pwg1(v1, Gaussian_function(1.0));
  PWG pwg2(v2, Gaussian_function(1.0));
  BOOST_CHECK(std::abs(pwg1.compute_scalar_product(pwg2) - std::exp(-0.5)/(std::sqrt(2*Gudhi::Persistence_representations::pi))) <= 1e-3);
}